

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitting_filter.cc
# Opt level: O0

void __thiscall
webrtc::SplittingFilter::ThreeBandsAnalysis
          (SplittingFilter *this,IFChannelBuffer *data,IFChannelBuffer *bands)

{
  float *in;
  size_type sVar1;
  reference this_00;
  pointer this_01;
  ChannelBuffer<float> *pCVar2;
  float **ppfVar3;
  size_t length;
  ulong local_1c8;
  size_t i;
  FatalMessage local_1b0;
  size_t local_38;
  size_type local_30;
  string *local_28;
  string *_result;
  IFChannelBuffer *bands_local;
  IFChannelBuffer *data_local;
  SplittingFilter *this_local;
  
  _result = (string *)bands;
  bands_local = data;
  data_local = (IFChannelBuffer *)this;
  local_30 = std::
             vector<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>,_std::allocator<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>_>_>
             ::size(&this->three_band_filter_banks_);
  local_38 = IFChannelBuffer::num_channels(bands_local);
  local_28 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&local_30,&local_38,
                        "three_band_filter_banks_.size() == data->num_channels()");
  if (local_28 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/splitting_filter.cc"
               ,0x58,local_28);
    rtc::FatalMessage::stream(&local_1b0);
    rtc::FatalMessage::~FatalMessage(&local_1b0);
  }
  local_1c8 = 0;
  local_28 = (string *)0x0;
  while( true ) {
    sVar1 = std::
            vector<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>,_std::allocator<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>_>_>
            ::size(&this->three_band_filter_banks_);
    if (sVar1 <= local_1c8) break;
    this_00 = std::
              vector<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>,_std::allocator<std::unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>_>_>
              ::operator[](&this->three_band_filter_banks_,local_1c8);
    this_01 = std::
              unique_ptr<webrtc::ThreeBandFilterBank,_std::default_delete<webrtc::ThreeBandFilterBank>_>
              ::operator->(this_00);
    pCVar2 = IFChannelBuffer::fbuf_const(bands_local);
    ppfVar3 = ChannelBuffer<float>::channels(pCVar2);
    in = ppfVar3[local_1c8];
    length = IFChannelBuffer::num_frames(bands_local);
    pCVar2 = IFChannelBuffer::fbuf((IFChannelBuffer *)_result);
    ppfVar3 = ChannelBuffer<float>::bands(pCVar2,local_1c8);
    ThreeBandFilterBank::Analysis(this_01,in,length,ppfVar3);
    local_1c8 = local_1c8 + 1;
  }
  return;
}

Assistant:

void SplittingFilter::ThreeBandsAnalysis(const IFChannelBuffer* data,
                                         IFChannelBuffer* bands) {
  RTC_DCHECK_EQ(three_band_filter_banks_.size(), data->num_channels());
  for (size_t i = 0; i < three_band_filter_banks_.size(); ++i) {
    three_band_filter_banks_[i]->Analysis(data->fbuf_const()->channels()[i],
                                          data->num_frames(),
                                          bands->fbuf()->bands(i));
  }
}